

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.cpp
# Opt level: O0

void helics::detail::addCodeAndSize(byte *data,byte code,size_t size)

{
  undefined8 in_RDX;
  undefined1 in_SIL;
  undefined1 *in_RDI;
  
  memset(in_RDI,0,8);
  *in_RDI = in_SIL;
  in_RDI[3] = 0;
  in_RDI[4] = (char)((ulong)in_RDX >> 0x18);
  in_RDI[5] = (char)((ulong)in_RDX >> 0x10);
  in_RDI[6] = (char)((ulong)in_RDX >> 8);
  in_RDI[7] = (char)in_RDX;
  return;
}

Assistant:

static inline void addCodeAndSize(std::byte* data, std::byte code, size_t size)
{
    std::memset(data, 0, 8);
    data[0] = code;
    data[3] = littleEndianCode;
    data[4] = static_cast<std::byte>((size >> 24U) & 0xFFU);
    data[5] = static_cast<std::byte>((size >> 16U) & 0xFFU);
    data[6] = static_cast<std::byte>((size >> 8U) & 0xFFU);
    data[7] = static_cast<std::byte>((size & 0xFFU));
}